

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

_Bool mon_take_hit(monster_conflict *mon,player *p,wchar_t dam,_Bool *fear,char *note)

{
  byte *pbVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  _Bool _Var4;
  short sVar5;
  uint uVar6;
  
  if ((monster_conflict *)p->upkeep->health_who == mon) {
    pbVar1 = (byte *)((long)&p->upkeep->redraw + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  if (dam <= mon->hp) {
    monster_wake(mon,false,L'd');
    mon_clear_timed((monster *)mon,L'\x06',L'\x01');
  }
  _Var3 = monster_is_camouflaged((monster *)mon);
  if (_Var3) {
    become_aware((chunk *)cave,mon);
  }
  if (dam == L'\0') {
    _Var3 = false;
  }
  else {
    p->timed[0x2e] = 0;
    uVar6 = *(int *)&mon->hp - dam;
    sVar5 = (short)uVar6;
    mon->hp = sVar5;
    _Var3 = SUB41((uVar6 & 0xffff) >> 0xf,0);
    if (sVar5 < 0) {
      ppVar2 = p->upkeep;
      if (ppVar2->arena_level == true) {
        ppVar2->generate_level = true;
        ppVar2->health_who = (monster *)mon;
      }
      else {
        player_kill_monster(mon,p,note);
      }
      _Var4 = false;
    }
    else {
      _Var4 = monster_scared_by_damage(mon,dam);
    }
    *fear = _Var4;
  }
  return _Var3;
}

Assistant:

bool mon_take_hit(struct monster *mon, struct player *p, int dam, bool *fear,
		const char *note)
{
	/* Redraw (later) if needed */
	if (p->upkeep->health_who == mon)
		p->upkeep->redraw |= (PR_HEALTH);

	/* If the hit doesn't kill, wake it up, make it aware of the player */
	if (dam <= mon->hp) {
		monster_wake(mon, false, 100);
		mon_clear_timed(mon, MON_TMD_HOLD, MON_TMD_FLG_NOTIFY);
	}

	/* Become aware of its presence */
	if (monster_is_camouflaged(mon))
		become_aware(cave, mon);

	/* No damage, we're done */
	if (dam == 0) return false;

	/* Covering tracks is no longer possible */
	p->timed[TMD_COVERTRACKS] = 0;

	/* Hurt it */
	mon->hp -= dam;
	if (mon->hp < 0) {
		/* Deal with arena monsters */
		if (p->upkeep->arena_level) {
			p->upkeep->generate_level = true;
			p->upkeep->health_who = mon;
			(*fear) = false;
			return true;
		}

		/* It is dead now */
		player_kill_monster(mon, p, note);

		/* Not afraid */
		(*fear) = false;

		/* Monster is dead */
		return true;
	} else {
		/* Did it get frightened? */
		(*fear) = monster_scared_by_damage(mon, dam);

		/* Not dead yet */
		return false;
	}
}